

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O1

ExprNode * parse_atom(ParserState *ps)

{
  void *pvVar1;
  Token TVar2;
  void *pvVar3;
  ptrlen input;
  size_t __n;
  bool bVar4;
  bool bVar5;
  _Bool _Var6;
  _Bool _Var7;
  uint uVar8;
  char *end;
  ExprNode *pEVar9;
  ExprNode *pEVar10;
  ExprNode **ppEVar11;
  char *pcVar12;
  char *start_3;
  ExprNode *unaff_R12;
  char *start_2;
  uint unaff_R13D;
  size_t sVar13;
  char *start;
  size_t sVar14;
  char *end_1;
  void *pvVar15;
  void *pvVar16;
  ptrlen prefix;
  ptrlen input_00;
  ptrlen input_01;
  ptrlen input_02;
  ptrlen input_03;
  ptrlen input_04;
  ptrlen tail;
  uint local_54;
  ptrlen local_48;
  size_t local_38;
  
  TVar2 = ps->tok;
  if (TVar2 != TOK_ATOM) {
    if (TVar2 == TOK_NOT) {
      pvVar3 = (ps->toktext).ptr;
      advance(ps);
      pEVar9 = parse_atom(ps);
      if (pEVar9 == (ExprNode *)0x0) {
        return (ExprNode *)0x0;
      }
      pvVar15 = (void *)((long)(pEVar9->text).ptr + (pEVar9->text).len);
      if (pvVar3 <= pvVar15) {
        pEVar10 = (ExprNode *)safemalloc(1,0x28,0);
        *(undefined8 *)pEVar10 = 0;
        (pEVar10->text).ptr = (void *)0x0;
        (pEVar10->text).len = 0;
        (pEVar10->field_2).field_0.subexprs = (ExprNode **)0x0;
        (pEVar10->field_2).field_0.nsubexprs = 0;
        pEVar10->op = OP_NOT;
        (pEVar10->text).ptr = pvVar3;
        (pEVar10->text).len = (long)pvVar15 - (long)pvVar3;
        (pEVar10->field_2).field_0.subexprs = (ExprNode **)pEVar9;
        return pEVar10;
      }
LAB_0015f67a:
      __assert_fail("end >= start",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/misc.h",0xbb,
                    "ptrlen make_ptrlen_startend(const void *, const void *)");
    }
    if (TVar2 == TOK_LPAR) {
      pvVar3 = (ps->toktext).ptr;
      advance(ps);
      pEVar9 = parse_expr(ps);
      if (pEVar9 == (ExprNode *)0x0) {
        return (ExprNode *)0x0;
      }
      if (ps->tok != TOK_RPAR) {
        pcVar12 = dupstr("expected \')\' after parenthesised subexpression");
        if (ps->err == (char *)0x0) {
          pvVar3 = (pEVar9->text).ptr;
          sVar14 = (pEVar9->text).len;
          ps->err = pcVar12;
          (ps->errloc).ptr = pvVar3;
          (ps->errloc).len = sVar14;
        }
        else {
          safefree(pcVar12);
        }
        exprnode_free(pEVar9);
        return (ExprNode *)0x0;
      }
      pvVar15 = (void *)((long)(ps->toktext).ptr + (ps->toktext).len);
      advance(ps);
      if (pvVar3 <= pvVar15) {
        (pEVar9->text).ptr = pvVar3;
        (pEVar9->text).len = (long)pvVar15 - (long)pvVar3;
        return pEVar9;
      }
      goto LAB_0015f67a;
    }
    goto LAB_0015f590;
  }
  _Var6 = ptrlen_contains(ps->toktext,":/");
  if (!_Var6) {
    pvVar3 = (ps->toktext).ptr;
    sVar14 = (ps->toktext).len;
    pEVar9 = (ExprNode *)safemalloc(1,0x28,0);
    *(undefined8 *)pEVar9 = 0;
    (pEVar9->text).ptr = (void *)0x0;
    (pEVar9->text).len = 0;
    (pEVar9->field_2).field_0.subexprs = (ExprNode **)0x0;
    (pEVar9->field_2).field_0.nsubexprs = 0;
    pEVar9->op = OP_HOSTNAME_WC;
    (pEVar9->text).ptr = pvVar3;
    (pEVar9->text).len = sVar14;
    ppEVar11 = (ExprNode **)mkstr(ps->toktext);
    (pEVar9->field_2).field_0.subexprs = ppEVar11;
    advance(ps);
    return pEVar9;
  }
  prefix.len = 5;
  prefix.ptr = "port:";
  _Var6 = ptrlen_startswith(ps->toktext,prefix,&local_48);
  if (_Var6) {
    if ((CONCAT44(local_48.len._4_4_,(undefined4)local_48.len) == 0) ||
       (input_00.ptr._4_4_ = local_48.ptr._4_4_, input_00.ptr._0_4_ = local_48.ptr._0_4_,
       input_00.len = CONCAT44(local_48.len._4_4_,(undefined4)local_48.len),
       _Var7 = ptrlen_contains_only(input_00,"0123456789"), !_Var7)) {
      pvVar3 = (void *)CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_);
      __n = CONCAT44(local_48.len._4_4_,(undefined4)local_48.len);
      pvVar15 = memchr(pvVar3,0x2d,__n);
      if (pvVar15 == (void *)0x0) {
        bVar5 = false;
LAB_0015f508:
        if (!bVar5) {
          pcVar12 = dupstr("unable to parse port number specification");
          if (ps->err == (char *)0x0) {
            local_48.ptr._0_4_ = *(undefined4 *)&(ps->toktext).ptr;
            local_48.ptr._4_4_ = *(undefined4 *)((long)&(ps->toktext).ptr + 4);
            local_48.len._0_4_ = (undefined4)(ps->toktext).len;
            local_48.len._4_4_ = *(undefined4 *)((long)&(ps->toktext).len + 4);
            goto LAB_0015f580;
          }
          goto LAB_0015f572;
        }
        pvVar3 = (ps->toktext).ptr;
        sVar14 = (ps->toktext).len;
        unaff_R12 = (ExprNode *)safemalloc(1,0x28,0);
        *(undefined8 *)unaff_R12 = 0;
        (unaff_R12->text).ptr = (void *)0x0;
        (unaff_R12->text).len = 0;
        (unaff_R12->field_2).field_0.subexprs = (ExprNode **)0x0;
        (unaff_R12->field_2).field_0.nsubexprs = 0;
        unaff_R12->op = OP_PORT_RANGE;
        (unaff_R12->text).ptr = pvVar3;
        (unaff_R12->text).len = sVar14;
        (unaff_R12->field_2).field_3.lo = unaff_R13D;
        (unaff_R12->field_2).field_3.hi = local_54;
        advance(ps);
        goto LAB_0015f58b;
      }
      sVar14 = (long)pvVar15 - (long)pvVar3;
      if (pvVar15 < pvVar3) goto LAB_0015f67a;
      pvVar1 = (void *)((long)pvVar15 + 1);
      pvVar16 = (void *)(__n + (long)pvVar3);
      sVar13 = (long)pvVar16 - (long)pvVar1;
      if (pvVar16 < pvVar1) goto LAB_0015f67a;
      bVar4 = true;
      if (pvVar15 == pvVar3) {
        bVar5 = false;
      }
      else {
        input_01.len = sVar14;
        input_01.ptr = pvVar3;
        local_38 = __n;
        _Var7 = ptrlen_contains_only(input_01,"0123456789");
        bVar5 = false;
        if ((pvVar16 != pvVar1) && (_Var7)) {
          input_02.len = sVar13;
          input_02.ptr = pvVar1;
          _Var7 = ptrlen_contains_only(input_02,"0123456789");
          if (_Var7) {
            input_03.len = sVar14;
            input_03.ptr = pvVar3;
            uVar8 = ptrlen_to_port_number(input_03);
            if (uVar8 < 0x10000) {
              input_04.len = sVar13;
              input_04.ptr = pvVar1;
              local_54 = ptrlen_to_port_number(input_04);
              if (local_54 < 0x10000) {
                bVar5 = true;
                sVar13 = (size_t)uVar8;
                if (local_54 < uVar8) {
                  pcVar12 = dupstr("port number range is backwards");
                  if ((long)local_38 < 0) goto LAB_0015f67a;
                  if (ps->err == (char *)0x0) {
                    ps->err = pcVar12;
                    (ps->errloc).ptr = pvVar3;
                    (ps->errloc).len = local_38;
                  }
                  else {
                    safefree(pcVar12);
                  }
                  bVar5 = false;
                  bVar4 = false;
                  goto LAB_0015f500;
                }
                goto LAB_0015f4fe;
              }
              pcVar12 = dupstr("port number too large");
              if (ps->err == (char *)0x0) {
                ps->err = pcVar12;
                (ps->errloc).ptr = pvVar1;
                (ps->errloc).len = sVar13;
              }
              else {
                safefree(pcVar12);
              }
            }
            else {
              pcVar12 = dupstr("port number too large");
              if (ps->err == (char *)0x0) {
                ps->err = pcVar12;
                (ps->errloc).ptr = pvVar3;
                (ps->errloc).len = sVar14;
              }
              else {
                safefree(pcVar12);
              }
            }
            bVar5 = false;
            bVar4 = false;
            sVar13 = (size_t)uVar8;
            goto LAB_0015f500;
          }
          bVar5 = false;
        }
LAB_0015f4fe:
        bVar4 = true;
      }
LAB_0015f500:
      unaff_R13D = (uint)sVar13;
      if (bVar4) goto LAB_0015f508;
    }
    else {
      input.ptr._4_4_ = local_48.ptr._4_4_;
      input.ptr._0_4_ = local_48.ptr._0_4_;
      input.len._0_4_ = (undefined4)local_48.len;
      input.len._4_4_ = local_48.len._4_4_;
      local_54 = ptrlen_to_port_number(input);
      if (local_54 < 0x10000) {
        bVar5 = true;
        unaff_R13D = local_54;
        goto LAB_0015f508;
      }
      pcVar12 = dupstr("port number too large");
      if (ps->err == (char *)0x0) {
LAB_0015f580:
        ps->err = pcVar12;
        *(undefined4 *)&(ps->errloc).ptr = local_48.ptr._0_4_;
        *(undefined4 *)((long)&(ps->errloc).ptr + 4) = local_48.ptr._4_4_;
        *(undefined4 *)&(ps->errloc).len = (undefined4)local_48.len;
        *(undefined4 *)((long)&(ps->errloc).len + 4) = local_48.len._4_4_;
      }
      else {
LAB_0015f572:
        safefree(pcVar12);
      }
    }
    unaff_R12 = (ExprNode *)0x0;
  }
LAB_0015f58b:
  if (_Var6) {
    return unaff_R12;
  }
LAB_0015f590:
  pcVar12 = dupstr("expected a predicate or a parenthesised subexpression");
  if (ps->err == (char *)0x0) {
    pvVar3 = (ps->toktext).ptr;
    sVar14 = (ps->toktext).len;
    ps->err = pcVar12;
    (ps->errloc).ptr = pvVar3;
    (ps->errloc).len = sVar14;
  }
  else {
    safefree(pcVar12);
  }
  return (ExprNode *)0x0;
}

Assistant:

static ExprNode *parse_atom(ParserState *ps)
{
    if (ps->tok == TOK_LPAR) {
        ptrlen openpar = ps->toktext;
        advance(ps);                   /* eat the ( */

        ExprNode *subexpr = parse_expr(ps);
        if (!subexpr)
            return NULL;

        if (ps->tok != TOK_RPAR) {
            error(ps, dupstr("expected ')' after parenthesised subexpression"),
                  subexpr->text);
            exprnode_free(subexpr);
            return NULL;
        }

        ptrlen closepar = ps->toktext;
        advance(ps);                   /* eat the ) */

        /* We can reuse the existing AST node, but we need to extend
         * its bounds within the input expression to include the
         * parentheses */
        subexpr->text = make_ptrlen_startend(
            openpar.ptr, ptrlen_end(closepar));
        return subexpr;
    }

    if (ps->tok == TOK_NOT) {
        ptrlen notloc = ps->toktext;
        advance(ps);                   /* eat the ! */

        ExprNode *subexpr = parse_atom(ps);
        if (!subexpr)
            return NULL;

        ExprNode *en = exprnode_new(
            OP_NOT, make_ptrlen_startend(
                notloc.ptr, ptrlen_end(subexpr->text)));
        en->subexpr = subexpr;
        return en;
    }

    if (ps->tok == TOK_ATOM) {
        if (atom_is_hostname_wc(ps->toktext)) {
            /* Hostname wildcard. */
            ExprNode *en = exprnode_new(OP_HOSTNAME_WC, ps->toktext);
            en->wc = mkstr(ps->toktext);
            advance(ps);
            return en;
        }

        ptrlen tail;
        if (ptrlen_startswith(ps->toktext, PTRLEN_LITERAL("port:"), &tail)) {
            /* Port number (single or range). */
            unsigned lo, hi;
            char *minus;
            static const char DIGITS[] = "0123456789\0";
            bool parse_ok = false;

            if (tail.len > 0 && ptrlen_contains_only(tail, DIGITS)) {
                lo = ptrlen_to_port_number(tail);
                if (lo >= 65536) {
                    error(ps, dupstr("port number too large"), tail);
                    return NULL;
                }
                hi = lo;
                parse_ok = true;
            } else if ((minus = memchr(tail.ptr, '-', tail.len)) != NULL) {
                ptrlen pl_lo = make_ptrlen_startend(tail.ptr, minus);
                ptrlen pl_hi = make_ptrlen_startend(minus+1, ptrlen_end(tail));
                if (pl_lo.len > 0 && ptrlen_contains_only(pl_lo, DIGITS) &&
                    pl_hi.len > 0 && ptrlen_contains_only(pl_hi, DIGITS)) {

                    lo = ptrlen_to_port_number(pl_lo);
                    if (lo >= 65536) {
                        error(ps, dupstr("port number too large"), pl_lo);
                        return NULL;
                    }

                    hi = ptrlen_to_port_number(pl_hi);
                    if (hi >= 65536) {
                        error(ps, dupstr("port number too large"), pl_hi);
                        return NULL;
                    }

                    if (hi < lo) {
                        error(ps, dupstr("port number range is backwards"),
                              make_ptrlen_startend(pl_lo.ptr,
                                                   ptrlen_end(pl_hi)));
                        return NULL;
                    }

                    parse_ok = true;
                }
            }

            if (!parse_ok) {
                error(ps, dupstr("unable to parse port number specification"),
                      ps->toktext);
                return NULL;
            }


            ExprNode *en = exprnode_new(OP_PORT_RANGE, ps->toktext);
            en->lo = lo;
            en->hi = hi;
            advance(ps);
            return en;
        }
    }

    error(ps, dupstr("expected a predicate or a parenthesised subexpression"),
          ps->toktext);
    return NULL;
}